

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contains_or_position.hpp
# Opt level: O0

idx_t duckdb::ListSearchOp<true>
                (Vector *list_v,Vector *source_v,Vector *target_v,Vector *result_v,
                idx_t target_count)

{
  PhysicalType PVar1;
  LogicalType *this;
  undefined8 uVar2;
  Vector *in_RDX;
  idx_t unaff_retaddr;
  Vector *in_stack_00000008;
  Vector *in_stack_00000010;
  Vector *in_stack_00000018;
  Vector *in_stack_00000020;
  idx_t in_stack_00000070;
  Vector *in_stack_00000078;
  Vector *in_stack_00000080;
  PhysicalType type;
  undefined1 local_90 [55];
  allocator local_59;
  string local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  NotImplementedException *in_stack_ffffffffffffffc0;
  idx_t local_8;
  
  this = Vector::GetType(in_RDX);
  PVar1 = LogicalType::InternalType(this);
  switch(PVar1) {
  case BOOL:
  case INT8:
    local_8 = ListSearchSimpleOp<signed_char,true>
                        (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                         unaff_retaddr);
    break;
  case UINT8:
    local_8 = ListSearchSimpleOp<unsigned_char,true>
                        (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                         unaff_retaddr);
    break;
  case UINT16:
    local_8 = ListSearchSimpleOp<unsigned_short,true>
                        (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                         unaff_retaddr);
    break;
  case INT16:
    local_8 = ListSearchSimpleOp<short,true>
                        (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                         unaff_retaddr);
    break;
  case UINT32:
    local_8 = ListSearchSimpleOp<unsigned_int,true>
                        (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                         unaff_retaddr);
    break;
  case INT32:
    local_8 = ListSearchSimpleOp<int,true>
                        (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                         unaff_retaddr);
    break;
  case UINT64:
    local_8 = ListSearchSimpleOp<unsigned_long,true>
                        (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                         unaff_retaddr);
    break;
  case INT64:
    local_8 = ListSearchSimpleOp<long,true>
                        (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                         unaff_retaddr);
    break;
  case FLOAT:
    local_8 = ListSearchSimpleOp<float,true>
                        (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                         unaff_retaddr);
    break;
  case DOUBLE:
    local_8 = ListSearchSimpleOp<double,true>
                        (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                         unaff_retaddr);
    break;
  case INTERVAL:
    local_8 = ListSearchSimpleOp<duckdb::interval_t,true>
                        (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                         unaff_retaddr);
    break;
  case LIST:
  case STRUCT:
  case ARRAY:
    local_8 = ListSearchNestedOp<true>
                        (result_v,(Vector *)target_count,in_stack_00000080,in_stack_00000078,
                         in_stack_00000070);
    break;
  case VARCHAR:
    local_8 = ListSearchSimpleOp<duckdb::string_t,true>
                        (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                         unaff_retaddr);
    break;
  default:
    uVar2 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_58,"This function has not been implemented for logical type %s",&local_59);
    duckdb::TypeIdToString_abi_cxx11_((PhysicalType)local_90);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    __cxa_throw(uVar2,&NotImplementedException::typeinfo,
                NotImplementedException::~NotImplementedException);
  case UINT128:
    local_8 = ListSearchSimpleOp<duckdb::uhugeint_t,true>
                        (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                         unaff_retaddr);
    break;
  case INT128:
    local_8 = ListSearchSimpleOp<duckdb::hugeint_t,true>
                        (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                         unaff_retaddr);
  }
  return local_8;
}

Assistant:

idx_t ListSearchOp(Vector &list_v, Vector &source_v, Vector &target_v, Vector &result_v, idx_t target_count) {
	const auto type = target_v.GetType().InternalType();
	switch (type) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		return ListSearchSimpleOp<int8_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::INT16:
		return ListSearchSimpleOp<int16_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::INT32:
		return ListSearchSimpleOp<int32_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::INT64:
		return ListSearchSimpleOp<int64_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::INT128:
		return ListSearchSimpleOp<hugeint_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::UINT8:
		return ListSearchSimpleOp<uint8_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::UINT16:
		return ListSearchSimpleOp<uint16_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::UINT32:
		return ListSearchSimpleOp<uint32_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::UINT64:
		return ListSearchSimpleOp<uint64_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::UINT128:
		return ListSearchSimpleOp<uhugeint_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::FLOAT:
		return ListSearchSimpleOp<float, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::DOUBLE:
		return ListSearchSimpleOp<double, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::VARCHAR:
		return ListSearchSimpleOp<string_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::INTERVAL:
		return ListSearchSimpleOp<interval_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::STRUCT:
	case PhysicalType::LIST:
	case PhysicalType::ARRAY:
		return ListSearchNestedOp<RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	default:
		throw NotImplementedException("This function has not been implemented for logical type %s",
		                              TypeIdToString(type));
	}
}